

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O1

bool units::precise::custom::is_custom_unit_inverted(unit_data *UT)

{
  unit_data uVar1;
  byte bVar2;
  uint uVar3;
  
  uVar1 = *UT;
  if ((int)uVar1 << 0x1c < 0) {
    bVar2 = 1;
  }
  else if ((int)uVar1 << 0x1c == 0) {
    uVar3 = (((int)uVar1 << 0x15) >> 0x1d) + 3;
    if ((uVar3 < 7) && ((0x77U >> (uVar3 & 0x1f) & 1) != 0)) {
      bVar2 = 100 >> ((byte)uVar3 & 0x1f);
    }
    else {
      uVar3 = ((int)uVar1._0_1_ >> 4) + 7;
      if ((uVar3 < 0xf) && ((0x6143U >> (uVar3 & 0x1f) & 1) != 0)) {
        bVar2 = (byte)(0x1fbf >> ((byte)uVar3 & 0x1f));
      }
      else {
        bVar2 = ((uint)uVar1 & 0x3800) == 0x1800;
      }
    }
  }
  else {
    bVar2 = 0;
  }
  return (bool)(bVar2 & 1);
}

Assistant:

constexpr int kg() const { return kilogram_; }